

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O2

int mbedtls_poly1305_self_test(int verbose)

{
  size_t *psVar1;
  uchar (*pauVar2) [16];
  ulong uVar3;
  uchar (*key) [32];
  uchar (*input) [127];
  undefined1 auVar4 [16];
  uchar mac [16];
  
  key = test_keys;
  input = test_data;
  psVar1 = test_data_len;
  pauVar2 = test_mac;
  uVar3 = 0;
  while( true ) {
    if (uVar3 == 2) {
      if (verbose != 0) {
        putchar(10);
      }
      return 0;
    }
    if (verbose != 0) {
      printf("  Poly1305 test %u ",uVar3 & 0xffffffff);
    }
    mbedtls_poly1305_mac(*key,*input,*psVar1,mac);
    auVar4[0] = -((*pauVar2)[0] == mac[0]);
    auVar4[1] = -((*pauVar2)[1] == mac[1]);
    auVar4[2] = -((*pauVar2)[2] == mac[2]);
    auVar4[3] = -((*pauVar2)[3] == mac[3]);
    auVar4[4] = -((*pauVar2)[4] == mac[4]);
    auVar4[5] = -((*pauVar2)[5] == mac[5]);
    auVar4[6] = -((*pauVar2)[6] == mac[6]);
    auVar4[7] = -((*pauVar2)[7] == mac[7]);
    auVar4[8] = -((*pauVar2)[8] == mac[8]);
    auVar4[9] = -((*pauVar2)[9] == mac[9]);
    auVar4[10] = -((*pauVar2)[10] == mac[10]);
    auVar4[0xb] = -((*pauVar2)[0xb] == mac[0xb]);
    auVar4[0xc] = -((*pauVar2)[0xc] == mac[0xc]);
    auVar4[0xd] = -((*pauVar2)[0xd] == mac[0xd]);
    auVar4[0xe] = -((*pauVar2)[0xe] == mac[0xe]);
    auVar4[0xf] = -((*pauVar2)[0xf] == mac[0xf]);
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf)
        != 0xffff) break;
    if (verbose != 0) {
      puts("passed");
    }
    uVar3 = uVar3 + 1;
    key = key + 1;
    input = input + 1;
    psVar1 = psVar1 + 1;
    pauVar2 = pauVar2 + 1;
  }
  if (verbose == 0) {
    return -1;
  }
  puts("failed (mac)");
  return -1;
}

Assistant:

int mbedtls_poly1305_self_test( int verbose )
{
    unsigned char mac[16];
    unsigned i;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    for( i = 0U; i < 2U; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  Poly1305 test %u ", i );

        ret = mbedtls_poly1305_mac( test_keys[i],
                                    test_data[i],
                                    test_data_len[i],
                                    mac );
        ASSERT( 0 == ret, ( "error code: %i\n", ret ) );

        ASSERT( 0 == memcmp( mac, test_mac[i], 16U ), ( "failed (mac)\n" ) );

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}